

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

int Cudd_AddHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *pDVar1;
  DdHook *pDVar2;
  int iVar3;
  DdHook **ppDVar4;
  
  iVar3 = 0;
  if (where < 4) {
    pDVar2 = (&dd->preGCHook)[where];
    if ((&dd->preGCHook)[where] == (DdHook *)0x0) {
      ppDVar4 = &dd->preGCHook + where;
    }
    else {
      do {
        pDVar1 = pDVar2;
        if (pDVar1->f == f) {
          return 2;
        }
        pDVar2 = pDVar1->next;
      } while (pDVar1->next != (DdHook *)0x0);
      ppDVar4 = &pDVar1->next;
    }
    pDVar2 = (DdHook *)malloc(0x10);
    if (pDVar2 == (DdHook *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      iVar3 = 0;
    }
    else {
      pDVar2->next = (DdHook *)0x0;
      pDVar2->f = f;
      *ppDVar4 = pDVar2;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_AddHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook, *newHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there.
    ** If so, just return. */
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            return(2);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }
    /* The function was not in the list. Create a new item and append it
    ** to the end of the list. */
    newHook = ABC_ALLOC(DdHook,1);
    if (newHook == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    newHook->next = NULL;
    newHook->f = f;
    *hook = newHook;
    return(1);

}